

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  ulong uVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  U32 lowestValid;
  ulong *puVar9;
  ulong *puVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  ulong *puVar14;
  long lVar15;
  int iVar16;
  BYTE *litEnd;
  BYTE *pBVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong *puVar24;
  U32 UVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  ulong *puVar29;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_b0;
  uint local_a8;
  uint local_a4;
  ulong *local_a0;
  uint local_98;
  uint local_94;
  seqStore_t *local_90;
  ulong *local_88;
  ulong *local_80;
  BYTE *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong *local_60;
  long local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint *local_40;
  BYTE *local_38;
  
  local_78 = (ms->window).base;
  uVar22 = (ms->window).dictLimit;
  local_38 = local_78 + uVar22;
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_a8 = 6;
  if (local_94 < 6) {
    local_a8 = local_94;
  }
  if (local_a8 < 5) {
    local_a8 = 4;
  }
  puVar28 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar16 = (int)puVar28 - (int)local_78;
  local_48 = *rep;
  local_44 = iVar16 - uVar21;
  if (iVar16 - uVar22 <= uVar21) {
    local_44 = uVar22;
  }
  uVar21 = 0;
  if (ms->loadedDictEnd != 0) {
    local_44 = uVar22;
  }
  local_4c = rep[1];
  local_44 = iVar16 - local_44;
  local_98 = local_4c;
  if (local_44 < local_4c) {
    local_98 = uVar21;
  }
  uVar22 = local_48;
  if (local_44 < local_48) {
    uVar22 = uVar21;
  }
  ms->lazySkipping = 0;
  local_88 = (ulong *)((long)src + (srcSize - 0x10));
  uVar27 = ms->nextToUpdate;
  uVar18 = (ulong)uVar27;
  uVar13 = ((int)local_88 - (int)(local_78 + uVar18)) + 1;
  uVar11 = 8;
  if (uVar13 < 8) {
    uVar11 = uVar13;
  }
  if (local_88 < local_78 + uVar18) {
    uVar11 = uVar21;
  }
  if (uVar27 < uVar11 + uVar27) {
    uVar19 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (local_a4 == 5) {
        uVar26 = *(long *)(local_78 + uVar18) * -0x30e4432345000000;
LAB_01d6f0ba:
        UVar25 = (U32)((uVar26 ^ uVar19) >> (0x38U - cVar6 & 0x3f));
      }
      else {
        if (local_a4 == 6) {
          uVar26 = *(long *)(local_78 + uVar18) * -0x30e4432340650000;
          goto LAB_01d6f0ba;
        }
        UVar25 = (*(int *)(local_78 + uVar18) * -0x61c8864f ^ (uint)uVar19) >>
                 (0x18U - cVar6 & 0x1f);
      }
      ms->hashCache[(uint)uVar18 & 7] = UVar25;
      uVar18 = uVar18 + 1;
    } while (uVar11 + uVar27 != uVar18);
  }
  puVar24 = (ulong *)(srcSize + (long)src);
  local_40 = rep;
  if (puVar28 < local_88) {
    local_80 = (ulong *)((long)puVar24 + -7);
    local_68 = (ulong *)((long)puVar24 + -3);
    local_70 = (ulong *)((long)puVar24 + -1);
    local_60 = puVar24 + -4;
    local_a0 = puVar24;
    local_90 = seqStore;
    uVar21 = local_a4;
    do {
      local_58 = -(ulong)uVar22;
      if (uVar22 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)(((long)puVar28 + 1) - (ulong)uVar22) == *(int *)((long)puVar28 + 1)) {
          puVar10 = (ulong *)((long)puVar28 + 5);
          puVar12 = (ulong *)((long)puVar28 + local_58 + 5);
          puVar29 = puVar10;
          if (puVar10 < local_80) {
            uVar19 = *puVar10 ^ *puVar12;
            uVar18 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            if (*puVar12 == *puVar10) {
              puVar29 = (ulong *)((long)puVar28 + 0xd);
              puVar12 = (ulong *)((long)puVar28 + local_58 + 0xd);
              do {
                if (local_80 <= puVar29) goto LAB_01d6f23a;
                uVar19 = *puVar12;
                uVar26 = *puVar29;
                uVar20 = uVar26 ^ uVar19;
                uVar18 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (long)puVar29 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar10);
                puVar29 = puVar29 + 1;
                puVar12 = puVar12 + 1;
              } while (uVar19 == uVar26);
            }
          }
          else {
LAB_01d6f23a:
            if ((puVar29 < local_68) && ((int)*puVar12 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar29 < local_70) && ((short)*puVar12 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar29 < puVar24) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar12 == (char)*puVar29));
            }
            uVar18 = (long)puVar29 - (long)puVar10;
          }
          uVar18 = uVar18 + 4;
        }
      }
      local_b0 = 999999999;
      if (uVar21 == 6) {
        if (local_a8 == 6) {
          uVar19 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
        else if (local_a8 == 5) {
          uVar19 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
      }
      else if (uVar21 == 5) {
        if (local_a8 == 6) {
          uVar19 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
        else if (local_a8 == 5) {
          uVar19 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
        }
      }
      else if (local_a8 == 6) {
        uVar19 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
      }
      else if (local_a8 == 5) {
        uVar19 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
      }
      else {
        uVar19 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar28,(BYTE *)puVar24,&local_b0);
      }
      uVar26 = uVar18;
      if (uVar18 < uVar19) {
        uVar26 = uVar19;
      }
      if (uVar26 < 4) {
        uVar18 = (long)puVar28 - (long)src;
        puVar28 = (ulong *)((long)puVar28 + (uVar18 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar18);
        puVar24 = local_a0;
        uVar27 = local_98;
        uVar21 = local_a4;
      }
      else {
        puVar10 = puVar28;
        uVar20 = local_b0;
        if (uVar19 <= uVar18) {
          puVar10 = (ulong *)((long)puVar28 + 1);
          uVar20 = 1;
        }
        puVar24 = (ulong *)((long)puVar28 + local_58 + 0xd);
        do {
          if (local_88 <= puVar28) break;
          puVar29 = (ulong *)((long)puVar28 + 1);
          if (((uVar20 != 0) && (uVar22 != 0)) &&
             (*(int *)puVar29 == *(int *)((long)puVar29 + local_58))) {
            puVar12 = (ulong *)((long)puVar28 + 5);
            puVar14 = (ulong *)((long)puVar28 + local_58 + 5);
            puVar9 = puVar12;
            if (puVar12 < local_80) {
              uVar19 = *puVar12 ^ *puVar14;
              uVar18 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = uVar18 >> 3 & 0x1fffffff;
              if (*puVar14 == *puVar12) {
                puVar9 = (ulong *)((long)puVar28 + 0xd);
                puVar14 = puVar24;
                do {
                  if (local_80 <= puVar9) goto LAB_01d6f664;
                  uVar19 = *puVar14;
                  uVar3 = *puVar9;
                  uVar23 = uVar3 ^ uVar19;
                  uVar18 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = (long)puVar9 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar12);
                  puVar9 = puVar9 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar19 == uVar3);
              }
            }
            else {
LAB_01d6f664:
              if ((puVar9 < local_68) && ((int)*puVar14 == (int)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 4);
                puVar14 = (ulong *)((long)puVar14 + 4);
              }
              if ((puVar9 < local_70) && ((short)*puVar14 == (short)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 2);
                puVar14 = (ulong *)((long)puVar14 + 2);
              }
              if (puVar9 < local_a0) {
                puVar9 = (ulong *)((long)puVar9 + (ulong)((char)*puVar14 == (char)*puVar9));
              }
              uVar18 = (long)puVar9 - (long)puVar12;
            }
            if (uVar18 < 0xfffffffffffffffc) {
              uVar21 = 0x1f;
              if ((uint)uVar20 != 0) {
                for (; (uint)uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              if ((int)((uVar21 ^ 0x1f) + (int)uVar26 * 3 + -0x1e) < (int)(uVar18 + 4) * 3) {
                uVar20 = 1;
                puVar10 = puVar29;
                uVar26 = uVar18 + 4;
              }
            }
          }
          local_b0 = 999999999;
          if (local_a4 == 6) {
            if (local_a8 == 6) {
              uVar18 = ZSTD_RowFindBestMatch_noDict_6_6
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
            else if (local_a8 == 5) {
              uVar18 = ZSTD_RowFindBestMatch_noDict_6_5
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
            else {
              uVar18 = ZSTD_RowFindBestMatch_noDict_6_4
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
          }
          else if (local_a4 == 5) {
            if (local_a8 == 6) {
              uVar18 = ZSTD_RowFindBestMatch_noDict_5_6
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
            else if (local_a8 == 5) {
              uVar18 = ZSTD_RowFindBestMatch_noDict_5_5
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
            else {
              uVar18 = ZSTD_RowFindBestMatch_noDict_5_4
                                 (ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0);
            }
          }
          else if (local_a8 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0)
            ;
          }
          else if (local_a8 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0)
            ;
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar29,(BYTE *)local_a0,&local_b0)
            ;
          }
          bVar5 = true;
          if (3 < uVar18) {
            uVar21 = 0x1f;
            if ((uint)uVar20 != 0) {
              for (; (uint)uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            iVar16 = 0x1f;
            if ((uint)local_b0 != 0) {
              for (; (uint)local_b0 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            if ((int)((uVar21 ^ 0x1f) + (int)uVar26 * 4 + -0x1b) < (int)uVar18 * 4 - iVar16) {
              bVar5 = false;
              puVar10 = puVar29;
              uVar20 = local_b0;
              uVar26 = uVar18;
            }
          }
          puVar24 = (ulong *)((long)puVar24 + 1);
          puVar28 = puVar29;
        } while (!bVar5);
        uVar27 = local_98;
        if (3 < uVar20) {
          if ((src < puVar10) && (local_38 < (BYTE *)((long)puVar10 + (3 - uVar20)))) {
            puVar28 = puVar10;
            while (puVar10 = puVar28,
                  *(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + (2 - uVar20))) {
              puVar10 = (ulong *)((long)puVar28 - 1);
              uVar26 = uVar26 + 1;
              if ((puVar10 <= src) ||
                 (pBVar17 = (BYTE *)((long)puVar28 + (2 - uVar20)), puVar28 = puVar10,
                 pBVar17 <= local_38)) break;
            }
          }
          uVar27 = uVar22;
          uVar22 = (U32)uVar20 - 3;
        }
        uVar18 = (long)puVar10 - (long)src;
        if (local_60 < puVar10) {
          ZSTD_safecopyLiterals(local_90->lit,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_60);
        }
        else {
          puVar28 = (ulong *)local_90->lit;
          uVar19 = *(ulong *)((long)src + 8);
          *puVar28 = *src;
          puVar28[1] = uVar19;
          if (0x10 < uVar18) {
            pBVar17 = local_90->lit;
            uVar19 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar17 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar17 + 0x18) = uVar19;
            if (0x20 < (long)uVar18) {
              lVar15 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar7 = puVar2[1];
                pBVar1 = pBVar17 + lVar15 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar7;
                puVar2 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar7 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                lVar15 = lVar15 + 0x20;
              } while (pBVar1 + 0x20 < pBVar17 + uVar18);
            }
          }
        }
        puVar24 = local_a0;
        local_90->lit = local_90->lit + uVar18;
        if (0xffff < uVar18) {
          local_90->longLengthType = ZSTD_llt_literalLength;
          local_90->longLengthPos =
               (U32)((ulong)((long)local_90->sequences - (long)local_90->sequencesStart) >> 3);
        }
        psVar4 = local_90->sequences;
        psVar4->litLength = (U16)uVar18;
        psVar4->offBase = (U32)uVar20;
        if (0xffff < uVar26 - 3) {
          local_90->longLengthType = ZSTD_llt_matchLength;
          local_90->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_90->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar26 - 3);
        local_90->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar21 = ms->nextToUpdate;
          uVar18 = (ulong)uVar21;
          uVar11 = ((int)local_88 - (int)(local_78 + uVar18)) + 1;
          if (7 < uVar11) {
            uVar11 = 8;
          }
          if (local_88 < local_78 + uVar18) {
            uVar11 = 0;
          }
          if (uVar21 < uVar11 + uVar21) {
            uVar19 = ms->hashSalt;
            cVar6 = (char)ms->rowHashLog;
            do {
              if (local_a4 == 5) {
                uVar20 = *(long *)(local_78 + uVar18) * -0x30e4432345000000;
LAB_01d6f8f2:
                UVar25 = (U32)((uVar20 ^ uVar19) >> (0x38U - cVar6 & 0x3f));
              }
              else {
                if (local_a4 == 6) {
                  uVar20 = *(long *)(local_78 + uVar18) * -0x30e4432340650000;
                  goto LAB_01d6f8f2;
                }
                UVar25 = (*(int *)(local_78 + uVar18) * -0x61c8864f ^ (uint)uVar19) >>
                         (0x18U - cVar6 & 0x1f);
              }
              ms->hashCache[(uint)uVar18 & 7] = UVar25;
              uVar18 = uVar18 + 1;
            } while (uVar11 + uVar21 != uVar18);
          }
          ms->lazySkipping = 0;
        }
        puVar28 = (ulong *)((long)puVar10 + uVar26);
        src = puVar28;
        uVar21 = local_a4;
        if ((uVar27 != 0) && (puVar28 <= local_88)) {
          while (uVar11 = uVar22, uVar13 = uVar27, psVar8 = local_90, uVar18 = (ulong)uVar13,
                src = puVar28, uVar22 = uVar11, uVar27 = uVar13,
                (int)*puVar28 == *(int *)((long)puVar28 - uVar18)) {
            puVar10 = (ulong *)((long)puVar28 + 4);
            puVar12 = (ulong *)((long)puVar28 + (4 - uVar18));
            puVar29 = puVar10;
            if (puVar10 < local_80) {
              uVar26 = *puVar10 ^ *puVar12;
              uVar19 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = uVar19 >> 3 & 0x1fffffff;
              if (*puVar12 == *puVar10) {
                puVar29 = (ulong *)((long)puVar28 + 0xc);
                puVar12 = (ulong *)((long)puVar28 + (0xc - uVar18));
                do {
                  if (local_80 <= puVar29) goto LAB_01d6fa2e;
                  uVar18 = *puVar12;
                  uVar26 = *puVar29;
                  uVar20 = uVar26 ^ uVar18;
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (long)puVar29 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar10);
                  puVar29 = puVar29 + 1;
                  puVar12 = puVar12 + 1;
                } while (uVar18 == uVar26);
              }
            }
            else {
LAB_01d6fa2e:
              if ((puVar29 < local_68) && ((int)*puVar12 == (int)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 4);
                puVar12 = (ulong *)((long)puVar12 + 4);
              }
              if ((puVar29 < local_70) && ((short)*puVar12 == (short)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 2);
                puVar12 = (ulong *)((long)puVar12 + 2);
              }
              if (puVar29 < puVar24) {
                puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar12 == (char)*puVar29));
              }
              uVar19 = (long)puVar29 - (long)puVar10;
            }
            puVar10 = (ulong *)local_90->lit;
            if (local_60 < puVar28) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar10,(BYTE *)puVar28,(BYTE *)puVar28,(BYTE *)local_60);
              uVar21 = local_a4;
            }
            else {
              uVar18 = puVar28[1];
              *puVar10 = *puVar28;
              puVar10[1] = uVar18;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < uVar19 + 1) {
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(uVar19 + 1);
            psVar8->sequences = psVar4 + 1;
            puVar28 = (ulong *)((long)puVar28 + uVar19 + 4);
            src = puVar28;
            uVar22 = uVar13;
            uVar27 = uVar11;
            if ((uVar11 == 0) || (local_88 < puVar28)) break;
          }
        }
      }
      local_98 = uVar27;
    } while (puVar28 < local_88);
  }
  if (local_4c <= local_44) {
    local_4c = 0;
  }
  uVar21 = local_4c;
  if (uVar22 != 0) {
    uVar21 = local_48;
  }
  if (local_48 <= local_44) {
    uVar21 = local_4c;
    local_48 = 0;
  }
  if (uVar22 != 0) {
    local_48 = uVar22;
  }
  if (local_98 != 0) {
    uVar21 = local_98;
  }
  *local_40 = local_48;
  local_40[1] = uVar21;
  return (long)puVar24 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}